

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Mode __thiscall
Catch::Clara::Parser::handlePositional
          (Parser *this,size_t i,char c,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  long lVar1;
  ulong in_RCX;
  char in_DL;
  Mode *in_RDI;
  bool bVar2;
  string data;
  undefined4 in_stack_ffffffffffffff18;
  Type in_stack_ffffffffffffff1c;
  Token *this_00;
  Token local_88;
  byte local_52;
  allocator local_51;
  string local_50 [40];
  ulong local_28;
  char local_19;
  Mode local_4;
  
  local_52 = 0;
  local_88._35_1_ = 0;
  bVar2 = true;
  local_28 = in_RCX;
  if ((in_RDI[4] & MaybeShortOpt) == None) {
    local_19 = in_DL;
    std::allocator<char>::allocator();
    local_52 = 1;
    std::__cxx11::string::string(local_50,"",1,&local_51);
    local_88._35_1_ = 1;
    lVar1 = std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)local_19);
    bVar2 = lVar1 == -1;
  }
  if ((local_88._35_1_ & 1) != 0) {
    std::__cxx11::string::~string(local_50);
  }
  if ((local_52 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  if (bVar2) {
    local_4 = *in_RDI;
  }
  else {
    this_00 = &local_88;
    std::__cxx11::string::substr((ulong)this_00,local_28);
    Token::Token(this_00,in_stack_ffffffffffffff1c,(string *)0x1b6493);
    std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
    push_back((vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
              this_00,(value_type *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    Token::~Token((Token *)0x1b64b0);
    local_4 = None;
    std::__cxx11::string::~string((string *)&local_88);
  }
  return local_4;
}

Assistant:

Mode handlePositional( std::size_t i, char c, std::string const& arg, std::vector<Token>& tokens ) {
            if( inQuotes || std::string( "\0", 1 ).find( c ) == std::string::npos )
                return mode;

            std::string data = arg.substr( from, i-from );
            tokens.push_back( Token( Token::Positional, data ) );
            return None;
        }